

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O3

void Assimp::IFC::ConvertAxisPlacement(IfcMatrix4 *out,IfcAxis2Placement3D *in)

{
  IfcCartesianPoint *in_00;
  IfcDirection *pIVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  IfcVector3 loc;
  IfcVector3 local_68;
  IfcVector3 local_48;
  IfcVector3 local_30;
  
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_48.z = 0.0;
  in_00 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCartesianPoint>
                    (*(LazyObject **)
                      &(in->super_IfcPlacement).super_IfcGeometricRepresentationItem.field_0x30);
  ConvertCartesianPoint(&local_48,in_00);
  local_68.x = 0.0;
  local_68.y = 0.0;
  local_68.z = 1.0;
  local_30.x = 1.0;
  local_30.y = 0.0;
  local_30.z = 0.0;
  if (in->field_0x50 == '\x01') {
    pIVar1 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcDirection>
                       (*(LazyObject **)&(in->super_IfcPlacement).field_0x48);
    ConvertDirection(&local_68,pIVar1);
  }
  dVar2 = 0.0;
  dVar3 = 1.0;
  dVar5 = 0.0;
  if ((in->RefDirection).have == true) {
    pIVar1 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcDirection>((in->RefDirection).ptr.obj)
    ;
    ConvertDirection(&local_30,pIVar1);
    dVar2 = local_30.y;
    dVar3 = local_30.x;
    dVar5 = local_30.z;
  }
  dVar4 = 1.0 / SQRT(dVar5 * dVar5 + dVar3 * dVar3 + dVar2 * dVar2);
  dVar6 = dVar4 * dVar5 * local_68.z + dVar3 * dVar4 * local_68.x + dVar2 * dVar4 * local_68.y;
  dVar3 = dVar3 * dVar4 - local_68.x * dVar6;
  dVar2 = dVar2 * dVar4 - local_68.y * dVar6;
  dVar5 = dVar4 * dVar5 - dVar6 * local_68.z;
  dVar4 = 1.0 / SQRT(dVar5 * dVar5 + dVar3 * dVar3 + dVar2 * dVar2);
  dVar3 = dVar3 * dVar4;
  dVar2 = dVar2 * dVar4;
  dVar4 = dVar4 * dVar5;
  out->d1 = 0.0;
  out->d2 = 0.0;
  out->d3 = 0.0;
  out->d4 = 1.0;
  out->a4 = local_48.x;
  out->b4 = local_48.y;
  out->c4 = local_48.z;
  out->a1 = dVar3;
  out->b1 = dVar2;
  out->c1 = dVar4;
  out->a2 = local_68.y * dVar4 - dVar2 * local_68.z;
  out->b2 = local_68.z * dVar3 - dVar4 * local_68.x;
  out->c2 = local_68.x * dVar2 - dVar3 * local_68.y;
  out->a3 = local_68.x;
  out->b3 = local_68.y;
  out->c3 = local_68.z;
  return;
}

Assistant:

void ConvertAxisPlacement(IfcMatrix4& out, const Schema_2x3::IfcAxis2Placement3D& in)
{
    IfcVector3 loc;
    ConvertCartesianPoint(loc,in.Location);

    IfcVector3 z(0.f,0.f,1.f),r(1.f,0.f,0.f),x;

    if (in.Axis) {
        ConvertDirection(z,*in.Axis.Get());
    }
    if (in.RefDirection) {
        ConvertDirection(r,*in.RefDirection.Get());
    }

    IfcVector3 v = r.Normalize();
    IfcVector3 tmpx = z * (v*z);

    x = (v-tmpx).Normalize();
    IfcVector3 y = (z^x);

    IfcMatrix4::Translation(loc,out);
    AssignMatrixAxes(out,x,y,z);
}